

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Gia_Man_t * Acb_NtkDeriveMiterCnfInter2(Gia_Man_t *p,int iTar,int nTars)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Gia_Man_t *pGVar3;
  Gia_Man_t *pGVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  pGVar2 = Gia_ManDup(p);
  iVar5 = 0;
  if (0 < iTar) {
    iVar5 = iTar;
  }
  iVar6 = -nTars;
  while( true ) {
    iVar1 = pGVar2->vCis->nSize;
    bVar7 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar7) break;
    pGVar3 = Gia_ManDupUniv(pGVar2,iVar1 + iVar6);
    if (pGVar3->vCis->nSize != pGVar2->vCis->nSize) {
      __assert_fail("Gia_ManCiNum(pCof) == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                    ,0x984,"Gia_Man_t *Acb_NtkDeriveMiterCnfInter2(Gia_Man_t *, int, int)");
    }
    Gia_ManStop(pGVar2);
    pGVar2 = Acb_NtkEcoSynthesize(pGVar3);
    Gia_ManStop(pGVar3);
    iVar6 = iVar6 + 1;
  }
  pGVar3 = Gia_ManDupCofactorVar(pGVar2,iVar1 + (iTar - nTars),1);
  pGVar4 = Gia_ManDupCofactorVar(pGVar2,(iTar - nTars) + pGVar2->vCis->nSize,0);
  Gia_ManStop(pGVar2);
  pGVar2 = Acb_NtkEcoSynthesize(pGVar3);
  Gia_ManStop(pGVar3);
  pGVar3 = Acb_NtkEcoSynthesize(pGVar4);
  Gia_ManStop(pGVar4);
  printf("Cof0 : ");
  Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
  printf("Cof1 : ");
  Gia_ManPrintStats(pGVar3,(Gps_Par_t *)0x0);
  iVar5 = Gia_ManAndNum(pGVar3);
  if (iVar5 != 0) {
    iVar5 = Gia_ManAndNum(pGVar2);
    if (iVar5 != 0) {
      pGVar4 = Gia_ManInterOneInt(pGVar3,pGVar2,7);
      goto LAB_0032dc66;
    }
  }
  pGVar4 = Gia_ManDup(pGVar3);
LAB_0032dc66:
  Gia_ManStop(pGVar2);
  Gia_ManStop(pGVar3);
  pGVar2 = Abc_GiaSynthesizeInter(pGVar4);
  Gia_ManStop(pGVar4);
  pGVar3 = Gia_ManDupRemovePis(pGVar2,nTars);
  Gia_ManStop(pGVar2);
  return pGVar3;
}

Assistant:

Gia_Man_t * Acb_NtkDeriveMiterCnfInter2( Gia_Man_t * p, int iTar, int nTars )
{
//    extern Gia_Man_t * Gia_ManInterOne( Gia_Man_t * pNtkOn, Gia_Man_t * pNtkOff, int fVerbose );
    extern Gia_Man_t * Abc_GiaSynthesizeInter( Gia_Man_t * p );
    Gia_Man_t * pInter, * pCof0, * pCof1, * pCof = Gia_ManDup( p ); int v;
    for ( v = 0; v < iTar; v++ )
    {
        pCof = Gia_ManDupUniv( p = pCof, Gia_ManCiNum(pCof) - nTars + v );
        assert( Gia_ManCiNum(pCof) == Gia_ManCiNum(p) );
        Gia_ManStop( p );

        pCof = Acb_NtkEcoSynthesize( p = pCof );
        Gia_ManStop( p );
    }
    pCof0 = Gia_ManDupCofactorVar( pCof, Gia_ManCiNum(pCof) - nTars + iTar, 1 );
    pCof1 = Gia_ManDupCofactorVar( pCof, Gia_ManCiNum(pCof) - nTars + iTar, 0 );
    Gia_ManStop( pCof );
    pCof0 = Acb_NtkEcoSynthesize( p = pCof0 );
    Gia_ManStop( p );
    pCof1 = Acb_NtkEcoSynthesize( p = pCof1 );
    Gia_ManStop( p );

    printf( "Cof0 : " );
    Gia_ManPrintStats( pCof0, NULL );
    printf( "Cof1 : " );
    Gia_ManPrintStats( pCof1, NULL );

    if ( Gia_ManAndNum(pCof1) == 0 || Gia_ManAndNum(pCof0) == 0 )
        pInter = Gia_ManDup(pCof1);
    else
        pInter = Gia_ManInterOneInt( pCof1, pCof0, 7 );
    Gia_ManStop( pCof0 );
    Gia_ManStop( pCof1 );
    pInter = Abc_GiaSynthesizeInter( p = pInter );
    Gia_ManStop( p );
    //Gia_ManPrintStats( pInter, NULL );
    pInter = Gia_ManDupRemovePis( p = pInter, nTars );
    Gia_ManStop( p );
    //Gia_ManPrintStats( pInter, NULL );
    return pInter;
}